

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_uint nk_tt__find_table(nk_byte *data,nk_uint fontstart,char *tag)

{
  nk_ushort nVar1;
  uint uVar2;
  nk_uint nVar3;
  int local_34;
  nk_uint loc;
  nk_int i;
  nk_uint tabledir;
  nk_int num_tables;
  char *tag_local;
  nk_uint fontstart_local;
  nk_byte *data_local;
  
  nVar1 = nk_ttUSHORT(data + (ulong)fontstart + 4);
  local_34 = 0;
  while( true ) {
    if ((int)(uint)nVar1 <= local_34) {
      return 0;
    }
    uVar2 = fontstart + 0xc + local_34 * 0x10;
    if (((((uint)data[uVar2] == (int)*tag) && ((uint)data[(ulong)uVar2 + 1] == (int)tag[1])) &&
        ((uint)data[(ulong)uVar2 + 2] == (int)tag[2])) &&
       ((uint)data[(ulong)uVar2 + 3] == (int)tag[3])) break;
    local_34 = local_34 + 1;
  }
  nVar3 = nk_ttULONG(data + (ulong)uVar2 + 8);
  return nVar3;
}

Assistant:

NK_INTERN nk_uint
nk_tt__find_table(const nk_byte *data, nk_uint fontstart, const char *tag)
{
    /* @OPTIMIZE: binary search */
    nk_int num_tables = nk_ttUSHORT(data+fontstart+4);
    nk_uint tabledir = fontstart + 12;
    nk_int i;
    for (i = 0; i < num_tables; ++i) {
        nk_uint loc = tabledir + (nk_uint)(16*i);
        if (nk_tt_tag(data+loc+0, tag))
            return nk_ttULONG(data+loc+8);
    }
    return 0;
}